

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O3

void re2::SearchAltMatch(int iters,int nbytes,SearchImpl *search)

{
  string s;
  string local_50;
  StringPiece local_30;
  
  StopBenchmarkTiming();
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  MakeText(&local_50,nbytes);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  local_30.ptr_ = local_50._M_dataplus._M_p;
  local_30.length_ = (int)local_50._M_string_length;
  (*search)(iters,"\\C*",&local_30,kAnchored,true);
  SetBenchmarkBytesProcessed((long)nbytes * (long)iters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SearchAltMatch(int iters, int nbytes, SearchImpl* search) {
  StopBenchmarkTiming();
  string s;
  MakeText(&s, nbytes);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  search(iters, "\\C*", s, Prog::kAnchored, true);
  SetBenchmarkBytesProcessed(static_cast<int64>(iters)*nbytes);
}